

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

Operand * TR_Args(ast *node,bool isPush)

{
  byte bVar1;
  ast *a;
  byte in_DL;
  ast *in_RSI;
  IrSim *in_RDI;
  ast *s2;
  Operand *t1;
  C_IC *in_stack_fffffffffffffee8;
  IrSim *this;
  C_OP *in_stack_ffffffffffffff08;
  ast *in_stack_ffffffffffffff10;
  IrSim *in_stack_ffffffffffffff18;
  IrSim *in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 uVar2;
  
  bVar1 = in_DL & 1;
  uVar2 = 0;
  this = in_RDI;
  IrSim::newTmpVar(in_stack_ffffffffffffff58);
  a = sibling(in_RSI,2);
  TR_Exp(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (a != (ast *)0x0) {
    in_stack_fffffffffffffee8 = (C_IC *)child(a,1);
    TR_Args((ast *)CONCAT17(bVar1,CONCAT16(uVar2,in_stack_ffffffffffffffe8)),
            SUB81((ulong)a >> 0x38,0));
    Operand::~Operand((Operand *)0x11534b);
  }
  if ((bVar1 & 1) != 0) {
    IrSim::icArg(in_stack_ffffffffffffff18,(C_OP *)in_stack_ffffffffffffff10);
    IrSim::operator<<(this,in_stack_fffffffffffffee8);
    InterCode::~InterCode((InterCode *)this);
  }
  return (Operand *)in_RDI;
}

Assistant:

static Operand TR_Args(ast *node, bool isPush) {
    Operand t1 = irSim.newTmpVar();
    ast *s2 = sibling(node, 2);
    TR_Exp(node, t1);
//    irSim.useLastArrayAddr();
    if (s2) TR_Args(child(s2, 1), isPush);
    if (isPush) irSim << irSim.icArg(t1);
    return t1;
}